

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

bool duckdb::LocalFileSystem::IsPrivateFile(string *path_p,FileOpener *opener)

{
  _Alloc_hider _Var1;
  int iVar2;
  idx_t iVar3;
  IOException *this;
  string path;
  stat st;
  string local_f0;
  string local_d0;
  stat local_b0;
  
  FileSystem::ExpandPath(&local_d0,path_p,(optional_ptr<duckdb::FileOpener,_true>)opener);
  _Var1._M_p = local_d0._M_dataplus._M_p;
  iVar3 = GetFileUrlOffset(&local_d0);
  iVar2 = lstat(_Var1._M_p + iVar3,&local_b0);
  if (iVar2 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    return (local_b0.st_mode & 0x3f) == 0;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             "Failed to stat \'%s\' when checking file permissions, file may be missing or have incorrect permissions"
             ,"");
  IOException::IOException<char_const*>(this,&local_f0,local_d0._M_dataplus._M_p);
  __cxa_throw(this,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool LocalFileSystem::IsPrivateFile(const string &path_p, FileOpener *opener) {
	auto path = FileSystem::ExpandPath(path_p, opener);
	auto normalized_path = NormalizeLocalPath(path);

	struct stat st;

	if (lstat(normalized_path, &st) != 0) {
		throw IOException(
		    "Failed to stat '%s' when checking file permissions, file may be missing or have incorrect permissions",
		    path.c_str());
	}

	// If group or other have any permission, the file is not private
	if (st.st_mode & (S_IRGRP | S_IWGRP | S_IXGRP | S_IROTH | S_IWOTH | S_IXOTH)) {
		return false;
	}

	return true;
}